

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.h
# Opt level: O3

void __thiscall CodeWriter::CodeWriter(CodeWriter *this)

{
  (this->moonOutput)._M_dataplus._M_p = (pointer)&(this->moonOutput).field_2;
  (this->moonOutput)._M_string_length = 0;
  (this->moonOutput).field_2._M_local_buf[0] = '\0';
  (this->tab)._M_dataplus._M_p = (pointer)&(this->tab).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->tab,"\t","");
  (this->newLine)._M_dataplus._M_p = (pointer)&(this->newLine).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->newLine,"\n","");
  (this->comma)._M_dataplus._M_p = (pointer)&(this->comma).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->comma,",","");
  (this->loadOp)._M_dataplus._M_p = (pointer)&(this->loadOp).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->loadOp,"lw ","");
  (this->saveOp)._M_dataplus._M_p = (pointer)&(this->saveOp).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->saveOp,"sw ","");
  (this->entry)._M_dataplus._M_p = (pointer)&(this->entry).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->entry,"entry","");
  (this->halt)._M_dataplus._M_p = (pointer)&(this->halt).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->halt,"hlt","");
  (this->nop)._M_dataplus._M_p = (pointer)&(this->nop).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->nop,"nop","");
  (this->initStackPointer)._M_dataplus._M_p = (pointer)&(this->initStackPointer).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->initStackPointer,"addi\tr14,r0,topaddr","");
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

CodeWriter() = default;